

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O1

string<unsigned_short> * __thiscall
irr::core::string<unsigned_short>::operator=(string<unsigned_short> *this,unsigned_short *c)

{
  long lVar1;
  s32 l;
  long lVar2;
  unsigned_short *puVar3;
  unsigned_short *puVar4;
  ulong uVar5;
  uint uVar6;
  
  puVar3 = this->array;
  if (c == (unsigned_short *)0x0) {
    if (puVar3 == (unsigned_short *)0x0) {
      puVar3 = (unsigned_short *)operator_new__(2);
      this->array = puVar3;
      this->allocated = 1;
      this->used = 1;
    }
    *this->array = 0;
  }
  else if (puVar3 != c) {
    if (*c == 0) {
      lVar2 = 0;
    }
    else {
      lVar2 = 0;
      do {
        lVar1 = lVar2 + 1;
        lVar2 = lVar2 + 1;
      } while (c[lVar1] != 0);
    }
    uVar6 = (int)lVar2 + 1;
    this->used = uVar6;
    this->allocated = uVar6;
    puVar4 = (unsigned_short *)operator_new__((ulong)((int)lVar2 * 2 + 2));
    this->array = puVar4;
    uVar5 = 0;
    do {
      this->array[uVar5] = c[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
    if (puVar3 != (unsigned_short *)0x0) {
      operator_delete__(puVar3);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}